

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btMultibodyLink>::copy
          (btAlignedObjectArray<btMultibodyLink> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  btMultibodyLink *this_00;
  long in_RCX;
  btMultibodyLink *ptr;
  int i;
  undefined4 local_1c;
  
  for (local_1c = (int)dst; local_1c < (int)src; local_1c = local_1c + 1) {
    ptr = (btMultibodyLink *)(in_RCX + (long)local_1c * 600);
    this_00 = (btMultibodyLink *)btMultibodyLink::operator_new(600,ptr);
    btMultibodyLink::btMultibodyLink(this_00,ptr);
  }
  return local_1c;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}